

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

unique_ptr<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>_>
__thiscall pstore::broker::command_processor::parse(command_processor *this,message_type *msg)

{
  message_type *in_RDX;
  
  std::mutex::lock((mutex *)&msg[1].part_no);
  broker::parse((broker *)this,in_RDX,(partial_cmds *)(msg[1].payload._M_elems + 0x24));
  pthread_mutex_unlock((pthread_mutex_t *)&msg[1].part_no);
  return (__uniq_ptr_data<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>,_true,_true>
          )(__uniq_ptr_data<pstore::broker::broker_command,_std::default_delete<pstore::broker::broker_command>,_true,_true>
            )this;
}

Assistant:

auto command_processor::parse (brokerface::message_type const & msg)
            -> std::unique_ptr<broker_command> {
            std::lock_guard<decltype (cmds_mut_)> const lock{cmds_mut_};
            return ::pstore::broker::parse (msg, cmds_);
        }